

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

bool jsonnet::internal::allowed_at_end_of_operator(char c)

{
  char c_local;
  bool local_1;
  
  if ((((c == '!') || (c == '$')) || (c == '+')) || ((c == '-' || (c == '~')))) {
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool allowed_at_end_of_operator(char c) {
    switch (c) {
        case '+':
        case '-':
        case '~':
        case '!':
        case '$': return false;
    }
    return true;
}